

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

Status __thiscall leveldb::DBTest::TryReopen(DBTest *this,Options *options)

{
  FilterPolicy *in_RDX;
  Options local_e0;
  undefined1 local_80 [8];
  Options opts;
  Options *options_local;
  DBTest *this_local;
  
  opts.filter_policy = in_RDX;
  if ((long *)options->block_size != (long *)0x0) {
    (**(code **)(*(long *)options->block_size + 8))();
  }
  options->block_size = 0;
  Options::Options((Options *)local_80);
  if (opts.filter_policy == (FilterPolicy *)0x0) {
    CurrentOptions(&local_e0,(DBTest *)options);
    memcpy(local_80,&local_e0,0x60);
    opts.comparator._0_1_ = 1;
  }
  else {
    memcpy(local_80,opts.filter_policy,0x60);
  }
  memcpy(&options->block_restart_interval,local_80,0x60);
  DB::Open((DB *)this,(Options *)local_80,(string *)&options->env,(DB **)&options->block_size);
  return (Status)(char *)this;
}

Assistant:

Status TryReopen(Options* options) {
    delete db_;
    db_ = nullptr;
    Options opts;
    if (options != nullptr) {
      opts = *options;
    } else {
      opts = CurrentOptions();
      opts.create_if_missing = true;
    }
    last_options_ = opts;

    return DB::Open(opts, dbname_, &db_);
  }